

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::RenderingContext
          (RenderingContext *this,EglTestContext *eglTestCtx,EGLint *attribList,EGLConfig *config,
          EGLDisplay *display,EGLContext *sharedContext)

{
  int iVar1;
  deUint32 err;
  Library *pLVar2;
  undefined4 extraout_var;
  
  this->m_eglTestCtx = eglTestCtx;
  this->m_attribList = attribList;
  this->m_config = config;
  this->m_display = display;
  pLVar2 = EglTestContext::getLibrary(eglTestCtx);
  this->m_egl = pLVar2;
  this->m_context = (EGLContext)0x0;
  logAttribList(eglTestCtx,this->m_attribList);
  iVar1 = (*this->m_egl->_vptr_Library[6])
                    (this->m_egl,*this->m_display,*this->m_config,*sharedContext,this->m_attribList)
  ;
  this->m_context = (EGLContext)CONCAT44(extraout_var,iVar1);
  err = (*this->m_egl->_vptr_Library[0x1f])();
  eglu::checkError(err,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x21c);
  return;
}

Assistant:

RenderingContext::RenderingContext (const EglTestContext&	 eglTestCtx,
									const EGLint*			 attribList,
									const EGLConfig&		 config,
									const EGLDisplay&		 display,
									const EGLContext&		 sharedContext)
	: m_eglTestCtx		(eglTestCtx)
	, m_attribList		(attribList)
	, m_config			(config)
	, m_display			(display)
	, m_egl				(eglTestCtx.getLibrary())
	, m_context			(EGL_NO_CONTEXT)
{
	logAttribList(eglTestCtx, m_attribList);
	createContext(sharedContext);
}